

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

uint64_t __thiscall
r_comp::Decompiler::decompile
          (Decompiler *this,Image *image,ostringstream *stream,uint64_t time_offset,
          bool ignore_named_objects)

{
  uint64_t uVar1;
  ulong uVar2;
  
  this->ignore_named_objects = ignore_named_objects;
  uVar1 = decompile_references(this,image);
  for (uVar2 = 0;
      (uVar2 & 0xffff) <
      (ulong)((long)(image->code_segment).objects.m_vector.
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(image->code_segment).objects.m_vector.
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar2 = (ulong)((int)(uVar2 & 0xffff) + 1)) {
    decompile_object(this,(uint16_t)uVar2,stream,time_offset);
  }
  return uVar1;
}

Assistant:

uint64_t Decompiler::decompile(r_comp::Image *image, std::ostringstream *stream, uint64_t time_offset, bool ignore_named_objects)
{
    this->ignore_named_objects = ignore_named_objects;
    uint64_t object_count = decompile_references(image);

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        decompile_object(i, stream, time_offset);
    }

    return object_count;
}